

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_nearest_xyz(REF_NODE ref_node,REF_DBL *xyz,REF_INT *closest_node,REF_DBL *distance)

{
  REF_DBL *pRVar1;
  long lVar2;
  long lVar3;
  double __x;
  REF_DBL RVar4;
  double dVar5;
  
  *closest_node = -1;
  *distance = 1e+100;
  __x = 1e+100;
  lVar2 = 2;
  for (lVar3 = 0; lVar3 < ref_node->max; lVar3 = lVar3 + 1) {
    if (-1 < ref_node->global[lVar3]) {
      pRVar1 = ref_node->real;
      dVar5 = (xyz[2] - pRVar1[lVar2]) * (xyz[2] - pRVar1[lVar2]) +
              (xyz[1] - pRVar1[lVar2 + -1]) * (xyz[1] - pRVar1[lVar2 + -1]) +
              (*xyz - pRVar1[lVar2 + -2]) * (*xyz - pRVar1[lVar2 + -2]);
      if (dVar5 < __x) {
        *closest_node = (REF_INT)lVar3;
        *distance = dVar5;
        __x = dVar5;
      }
    }
    lVar2 = lVar2 + 0xf;
  }
  if (__x < 0.0) {
    RVar4 = sqrt(__x);
  }
  else {
    RVar4 = SQRT(__x);
  }
  *distance = RVar4;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_nearest_xyz(REF_NODE ref_node, REF_DBL *xyz,
                                        REF_INT *closest_node,
                                        REF_DBL *distance) {
  REF_INT node;
  REF_DBL dist;
  *closest_node = REF_EMPTY;
  *distance = 1.0e100;
  each_ref_node_valid_node(ref_node, node) {
    dist = pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
           pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
           pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2);
    if (dist < *distance) {
      *closest_node = node;
      *distance = dist;
    }
  }
  *distance = sqrt(*distance);
  return REF_SUCCESS;
}